

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O1

void __thiscall Omega_h::Adj::Adj(Adj *this,LOs *ab2b_,Read<signed_char> *codes_)

{
  int *piVar1;
  void *pvVar2;
  Alloc *pAVar3;
  bool bVar4;
  
  pAVar3 = (ab2b_->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar3 = (Alloc *)(pAVar3->size * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  pvVar2 = (ab2b_->write_).shared_alloc_.direct_ptr;
  (this->super_Graph).a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->super_Graph).a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->super_Graph).ab2b.write_.shared_alloc_.alloc = pAVar3;
  bVar4 = ((ulong)pAVar3 & 7) != 0;
  if (bVar4 || pAVar3 == (Alloc *)0x0) {
    (this->super_Graph).ab2b.write_.shared_alloc_.direct_ptr = pvVar2;
  }
  else {
    if (entering_parallel == '\x01') {
      (this->super_Graph).ab2b.write_.shared_alloc_.alloc = (Alloc *)(pAVar3->size * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
    (this->super_Graph).ab2b.write_.shared_alloc_.direct_ptr = pvVar2;
    if (!bVar4 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
  }
  pAVar3 = (codes_->write_).shared_alloc_.alloc;
  (this->codes).write_.shared_alloc_.alloc = pAVar3;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->codes).write_.shared_alloc_.alloc = (Alloc *)(pAVar3->size * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  (this->codes).write_.shared_alloc_.direct_ptr = (codes_->write_).shared_alloc_.direct_ptr;
  return;
}

Assistant:

Adj(LOs ab2b_, Read<I8> codes_) : Graph(ab2b_), codes(codes_) {}